

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CustomModel_CustomModelParamValue::SharedDtor
          (CustomModel_CustomModelParamValue *this)

{
  bool bVar1;
  Arena *pAVar2;
  LogMessage *other;
  LogFinisher local_5d [20];
  byte local_49;
  LogMessage local_48;
  CustomModel_CustomModelParamValue *local_10;
  CustomModel_CustomModelParamValue *this_local;
  
  local_10 = this;
  pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  local_49 = 0;
  if (pAVar2 != (Arena *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/CustomModel.pb.cc"
               ,0x7b);
    local_49 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(local_5d,other);
  }
  if ((local_49 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_48);
  }
  bVar1 = has_value(this);
  if (bVar1) {
    clear_value(this);
  }
  return;
}

Assistant:

inline void CustomModel_CustomModelParamValue::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  if (has_value()) {
    clear_value();
  }
}